

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::ErrorsTest(ErrorsTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"buffers_errors","Buffer Objects Errors Test");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_0212ace8;
  this->m_pClearNamedBufferData = (PFNGLCLEARNAMEDBUFFERDATA)0x0;
  this->m_pClearNamedBufferSubData = (PFNGLCLEARNAMEDBUFFERSUBDATA)0x0;
  this->m_pCopyNamedBufferSubData = (PFNGLCOPYNAMEDBUFFERSUBDATA)0x0;
  this->m_pFlushMappedNamedBufferRange = (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE)0x0;
  this->m_pGetNamedBufferParameteri64v = (PFNGLGETNAMEDBUFFERPARAMETERI64V)0x0;
  this->m_pGetNamedBufferParameteriv = (PFNGLGETNAMEDBUFFERPARAMETERIV)0x0;
  this->m_pGetNamedBufferPointerv = (PFNGLGETNAMEDBUFFERPOINTERV)0x0;
  this->m_pGetNamedBufferSubData = (PFNGLGETNAMEDBUFFERSUBDATA)0x0;
  this->m_pMapNamedBuffer = (PFNGLMAPNAMEDBUFFER)0x0;
  this->m_pMapNamedBufferRange = (PFNGLMAPNAMEDBUFFERRANGE)0x0;
  this->m_pNamedBufferData = (PFNGLNAMEDBUFFERDATA)0x0;
  this->m_pNamedBufferStorage = (PFNGLNAMEDBUFFERSTORAGE)0x0;
  this->m_pNamedBufferSubData = (PFNGLNAMEDBUFFERSUBDATA)0x0;
  this->m_pUnmapNamedBuffer = (PFNGLUNMAPNAMEDBUFFER)0x0;
  return;
}

Assistant:

ErrorsTest::ErrorsTest(deqp::Context& context)
	: deqp::TestCase(context, "buffers_errors", "Buffer Objects Errors Test")
	, m_pClearNamedBufferData(DE_NULL)
	, m_pClearNamedBufferSubData(DE_NULL)
	, m_pCopyNamedBufferSubData(DE_NULL)
	, m_pFlushMappedNamedBufferRange(DE_NULL)
	, m_pGetNamedBufferParameteri64v(DE_NULL)
	, m_pGetNamedBufferParameteriv(DE_NULL)
	, m_pGetNamedBufferPointerv(DE_NULL)
	, m_pGetNamedBufferSubData(DE_NULL)
	, m_pMapNamedBuffer(DE_NULL)
	, m_pMapNamedBufferRange(DE_NULL)
	, m_pNamedBufferData(DE_NULL)
	, m_pNamedBufferStorage(DE_NULL)
	, m_pNamedBufferSubData(DE_NULL)
	, m_pUnmapNamedBuffer(DE_NULL)
{
	/* Intentionally left blank. */
}